

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O1

void __thiscall cmCMakePresetsGraph::BuildPreset::~BuildPreset(BuildPreset *this)

{
  ~BuildPreset(this);
  operator_delete(this,0x168);
  return;
}

Assistant:

~BuildPreset() override = default;